

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_new_doc(Parser *this,csubstr rem)

{
  size_t indentation;
  Location LVar1;
  ro_substr pattern;
  bool bVar2;
  error_flags eVar3;
  Parser *in_RSI;
  Parser *in_RDI;
  size_t in_stack_00000018;
  Parser *in_stack_00000020;
  size_t indref;
  char msg [39];
  undefined7 in_stack_00000188;
  bool in_stack_0000018f;
  Parser *in_stack_00000190;
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  basic_substring<const_char> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  Location *this_00;
  size_t in_stack_ffffffffffffff68;
  pfn_error p_Var4;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  size_t local_60;
  Location local_58;
  basic_substring<char_const> local_28 [23];
  undefined1 explicit_flow_chars;
  
  unique0x1000034e = in_RDI;
  basic_substring<char_const>::basic_substring<4ul>(local_28,(char (*) [4])"---");
  explicit_flow_chars = (undefined1)((ulong)stack0xffffffffffffffe8 >> 0x38);
  pattern.len = in_stack_ffffffffffffff68;
  pattern.str = in_stack_ffffffffffffff60;
  bVar2 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff58,pattern);
  if (!bVar2) {
    memcpy(&local_58,"check failed: (rem.begins_with(\"---\"))",0x27);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    p_Var4 = (in_RDI->m_stack).m_callbacks.m_error;
    this_00 = &local_58;
    Location::Location(this_00,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    LVar1.super_LineCol.line = uStack_78;
    LVar1.super_LineCol.offset = local_80;
    LVar1.super_LineCol.col = local_70;
    LVar1.name.str = (char *)uStack_68;
    LVar1.name.len = local_60;
    (*p_Var4)((char *)this_00,0x27,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
  }
  _end_stream((Parser *)CONCAT17(in_stack_0000018f,in_stack_00000188));
  indentation = in_RDI->m_state->indref;
  _line_progressed(in_stack_00000020,in_stack_00000018);
  _push_level(in_RSI,(bool)explicit_flow_chars);
  _start_doc(in_stack_00000190,in_stack_0000018f);
  _set_indentation(in_RDI,indentation);
  return;
}

Assistant:

void Parser::_start_new_doc(csubstr rem)
{
    _c4dbgp("_start_new_doc");
    _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begins_with("---"));
    C4_UNUSED(rem);

    _end_stream();

    size_t indref = m_state->indref;
    _c4dbgpf("start a document, indentation={}", indref);
    _line_progressed(3);
    _push_level();
    _start_doc();
    _set_indentation(indref);
}